

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OCTET_STRING.c
# Opt level: O0

asn_dec_rval_t
OCTET_STRING_decode_uper
          (asn_codec_ctx_t *opt_codec_ctx,asn_TYPE_descriptor_t *td,
          asn_per_constraints_t *constraints,void **sptr,asn_per_data_t *pd)

{
  int32_t iVar1;
  int iVar2;
  asn_per_data_t *pd_00;
  void *pvVar3;
  ssize_t sVar4;
  ulong ub;
  asn_per_data_t *po;
  long *in_RCX;
  asn_per_constraints_t *in_RDX;
  undefined8 *in_RSI;
  char *pcVar5;
  asn_dec_rval_t aVar6;
  int ret_1;
  void *p;
  ssize_t len_bits;
  ssize_t len_bytes;
  ssize_t raw_len;
  int ubs;
  int ret;
  int inext;
  uint canonical_unit_bits;
  uint unit_bits;
  anon_enum_32 bpc;
  int repeat;
  ssize_t consumed_myself;
  BIT_STRING_t *st;
  asn_dec_rval_t rval;
  asn_per_constraint_t *csiz;
  asn_per_constraint_t *cval;
  asn_per_constraints_t *pc;
  asn_OCTET_STRING_specifics_t *specs;
  asn_dec_rval_t tmprval;
  long in_stack_ffffffffffffff08;
  asn_per_constraints_t *in_stack_ffffffffffffff10;
  asn_per_data_t *in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff24;
  asn_per_constraints_t *paVar7;
  asn_OCTET_STRING_specifics_t *paVar8;
  asn_OCTET_STRING_specifics_t *units;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  asn_per_data_t *in_stack_ffffffffffffff48;
  long local_a8;
  long in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  int local_90;
  uint local_88;
  uint local_84;
  uint local_80;
  int local_7c;
  long *local_70;
  ulong local_68;
  size_t local_60;
  asn_per_constraint_s *paVar9;
  asn_per_constraints_t *pd_01;
  ulong local_10;
  size_t local_8;
  
  if (in_RSI[0x13] == 0) {
    paVar8 = &asn_DEF_OCTET_STRING_specs;
  }
  else {
    paVar8 = (asn_OCTET_STRING_specifics_t *)in_RSI[0x13];
  }
  if (in_RDX == (asn_per_constraints_t *)0x0) {
    in_RDX = (asn_per_constraints_t *)in_RSI[0x10];
  }
  paVar7 = in_RDX;
  units = paVar8;
  memset(&local_68,0,0x10);
  local_70 = (long *)*in_RCX;
  pd_01 = in_RDX;
  if (in_RDX == (asn_per_constraints_t *)0x0) {
    pd_01 = &asn_DEF_OCTET_STRING_constraints;
  }
  paVar9 = &pd_01->size;
  pd_00 = (asn_per_data_t *)(ulong)paVar8->subvariant;
  switch(pd_00) {
  default:
    ASN_DEBUG("Unrecognized subvariant %d",(ulong)paVar8->subvariant);
    local_10 = 2;
    local_8 = 0;
    goto LAB_00165174;
  case (asn_per_data_t *)0x1:
    local_84 = 1;
    local_88 = 1;
    local_80 = 0;
    break;
  case (asn_per_data_t *)0x2:
    local_84 = 8;
    local_88 = 8;
    if (((pd_01->value).flags & APC_CONSTRAINED) != APC_UNCONSTRAINED) {
      local_84 = (pd_01->value).range_bits;
    }
    local_80 = 1;
    break;
  case (asn_per_data_t *)0x3:
    local_84 = 0x10;
    local_88 = 0x10;
    if (((pd_01->value).flags & APC_CONSTRAINED) != APC_UNCONSTRAINED) {
      local_84 = (pd_01->value).range_bits;
    }
    local_80 = 2;
    break;
  case (asn_per_data_t *)0x4:
    local_84 = 0x20;
    local_88 = 0x20;
    if (((pd_01->value).flags & APC_CONSTRAINED) != APC_UNCONSTRAINED) {
      local_84 = (pd_01->value).range_bits;
    }
    local_80 = 4;
  }
  if (local_70 == (long *)0x0) {
    local_70 = (long *)calloc(1,(long)paVar8->struct_size);
    *in_RCX = (long)local_70;
    if (local_70 == (long *)0x0) {
      local_10 = 2;
      local_8 = 0;
      goto LAB_00165174;
    }
  }
  pcVar5 = "non-extensible";
  if ((paVar9->flags & APC_EXTENSIBLE) != APC_UNCONSTRAINED) {
    pcVar5 = "extensible";
  }
  ASN_DEBUG("PER Decoding %s size %ld .. %ld bits %d",pcVar5,paVar9->lower_bound,paVar9->upper_bound
            ,(ulong)(uint)paVar9->effective_bits);
  if ((paVar9->flags & APC_EXTENSIBLE) != APC_UNCONSTRAINED) {
    iVar1 = per_get_few_bits((asn_per_data_t *)pd_01,(int)((ulong)paVar9 >> 0x20));
    if (iVar1 < 0) {
      local_10 = 1;
      local_8 = 0;
      goto LAB_00165174;
    }
    if (iVar1 != 0) {
      paVar9 = &asn_DEF_OCTET_STRING_constraints.size;
      pd_01 = &asn_DEF_OCTET_STRING_constraints;
      local_84 = local_88;
    }
  }
  if (-1 < paVar9->effective_bits) {
    free((void *)*local_70);
    if (local_80 == 0) {
      *(int *)(local_70 + 1) = (int)(paVar9->upper_bound + 7 >> 3);
    }
    else {
      *(uint *)(local_70 + 1) = (int)paVar9->upper_bound * local_80;
    }
    pvVar3 = malloc((long)((int)local_70[1] + 1));
    *local_70 = (long)pvVar3;
    if (*local_70 == 0) {
      *(undefined4 *)(local_70 + 1) = 0;
      local_10 = 2;
      local_8 = 0;
      goto LAB_00165174;
    }
  }
  if (paVar9->effective_bits == 0) {
    if (local_80 == 0) {
      ASN_DEBUG("Encoding BIT STRING size %ld",paVar9->upper_bound);
      local_90 = per_get_many_bits(in_stack_ffffffffffffff18,(uint8_t *)in_stack_ffffffffffffff10,
                                   (int)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                                   (int)in_stack_ffffffffffffff08);
    }
    else {
      ASN_DEBUG("Encoding OCTET STRING size %ld",paVar9->upper_bound);
      local_90 = OCTET_STRING_per_get_characters
                           (in_stack_ffffffffffffff48,
                            (uint8_t *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40)
                            ,(size_t)units,(uint)((ulong)paVar7 >> 0x20),(uint)paVar7,(long)pd_00,
                            in_stack_ffffffffffffff60,
                            (asn_per_constraints_t *)
                            CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      if (0 < local_90) {
        local_10 = 2;
        local_8 = 0;
        goto LAB_00165174;
      }
    }
    if (local_90 < 0) {
      local_10 = 1;
      local_8 = 0;
    }
    else {
      local_8 = (ulong)local_84 * paVar9->upper_bound;
      *(undefined1 *)(*local_70 + (long)(int)local_70[1]) = 0;
      if (local_80 == 0) {
        if ((paVar9->upper_bound & 7U) == 0) {
          iVar2 = 0;
        }
        else {
          iVar2 = 8 - ((uint)paVar9->upper_bound & 7);
        }
        *(int *)((long)local_70 + 0xc) = iVar2;
      }
      local_10 = 0;
    }
  }
  else {
    *(undefined4 *)(local_70 + 1) = 0;
    do {
      sVar4 = uper_get_length(pd_00,in_stack_ffffffffffffff24,(int *)in_stack_ffffffffffffff18);
      if (sVar4 < 0) {
        local_10 = 1;
        local_8 = 0;
        goto LAB_00165174;
      }
      ub = paVar9->lower_bound + sVar4;
      pcVar5 = "once";
      if (local_7c != 0) {
        pcVar5 = "repeat";
      }
      ASN_DEBUG("Got PER length eb %ld, len %ld, %s (%s)",(long)paVar9->effective_bits,ub,pcVar5,
                *in_RSI);
      if (local_80 == 0) {
        local_a8 = (long)(ub + 7) >> 3;
        if ((ub & 7) != 0) {
          *(uint *)((long)local_70 + 0xc) = 8 - ((uint)ub & 7);
        }
      }
      else {
        local_a8 = ub * local_80;
      }
      po = (asn_per_data_t *)realloc((void *)*local_70,(int)local_70[1] + local_a8 + 1);
      if (po == (asn_per_data_t *)0x0) {
        local_10 = 2;
        local_8 = 0;
        goto LAB_00165174;
      }
      *local_70 = (long)po;
      if (local_80 == 0) {
        in_stack_ffffffffffffff44 =
             per_get_many_bits(in_stack_ffffffffffffff18,(uint8_t *)in_stack_ffffffffffffff10,
                               (int)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                               (int)in_stack_ffffffffffffff08);
      }
      else {
        in_stack_ffffffffffffff08 = (pd_01->value).upper_bound;
        in_stack_ffffffffffffff10 = in_RDX;
        in_stack_ffffffffffffff44 =
             OCTET_STRING_per_get_characters
                       (po,(uint8_t *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                        (size_t)units,(uint)((ulong)paVar7 >> 0x20),(uint)paVar7,(long)pd_00,ub,
                        (asn_per_constraints_t *)
                        CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        if (0 < in_stack_ffffffffffffff44) {
          local_10 = 2;
          local_8 = 0;
          goto LAB_00165174;
        }
      }
      if (in_stack_ffffffffffffff44 < 0) {
        local_10 = 1;
        local_8 = 0;
        goto LAB_00165174;
      }
      *(int *)(local_70 + 1) = (int)local_70[1] + (int)local_a8;
    } while (local_7c != 0);
    *(undefined1 *)(*local_70 + (long)(int)local_70[1]) = 0;
    local_10 = local_68;
    local_8 = local_60;
  }
LAB_00165174:
  aVar6._0_8_ = local_10 & 0xffffffff;
  aVar6.consumed = local_8;
  return aVar6;
}

Assistant:

asn_dec_rval_t
OCTET_STRING_decode_uper(asn_codec_ctx_t *opt_codec_ctx,
	asn_TYPE_descriptor_t *td, asn_per_constraints_t *constraints,
	void **sptr, asn_per_data_t *pd) {

	asn_OCTET_STRING_specifics_t *specs = td->specifics
		? (asn_OCTET_STRING_specifics_t *)td->specifics
		: &asn_DEF_OCTET_STRING_specs;
	asn_per_constraints_t *pc = constraints ? constraints
				: td->per_constraints;
	asn_per_constraint_t *cval;
	asn_per_constraint_t *csiz;
	asn_dec_rval_t rval = { RC_OK, 0 };
	BIT_STRING_t *st = (BIT_STRING_t *)*sptr;
	ssize_t consumed_myself = 0;
	int repeat;
	enum {
		OS__BPC_BIT	= 0,
		OS__BPC_CHAR	= 1,
		OS__BPC_U16	= 2,
		OS__BPC_U32	= 4
	} bpc;	/* Bytes per character */
	unsigned int unit_bits;
	unsigned int canonical_unit_bits;

	(void)opt_codec_ctx;

	if(pc) {
		cval = &pc->value;
		csiz = &pc->size;
	} else {
		cval = &asn_DEF_OCTET_STRING_constraints.value;
		csiz = &asn_DEF_OCTET_STRING_constraints.size;
	}

	switch(specs->subvariant) {
	default:
	case ASN_OSUBV_ANY:
		ASN_DEBUG("Unrecognized subvariant %d", specs->subvariant);
		RETURN(RC_FAIL);
	case ASN_OSUBV_BIT:
		canonical_unit_bits = unit_bits = 1;
		bpc = OS__BPC_BIT;
		break;
	case ASN_OSUBV_STR:
		canonical_unit_bits = unit_bits = 8;
		if(cval->flags & APC_CONSTRAINED)
			unit_bits = cval->range_bits;
		bpc = OS__BPC_CHAR;
		break;
	case ASN_OSUBV_U16:
		canonical_unit_bits = unit_bits = 16;
		if(cval->flags & APC_CONSTRAINED)
			unit_bits = cval->range_bits;
		bpc = OS__BPC_U16;
		break;
	case ASN_OSUBV_U32:
		canonical_unit_bits = unit_bits = 32;
		if(cval->flags & APC_CONSTRAINED)
			unit_bits = cval->range_bits;
		bpc = OS__BPC_U32;
		break;
	}

	/*
	 * Allocate the string.
	 */
	if(!st) {
		st = (BIT_STRING_t *)(*sptr = CALLOC(1, specs->struct_size));
		if(!st) RETURN(RC_FAIL);
	}

	ASN_DEBUG("PER Decoding %s size %ld .. %ld bits %d",
		csiz->flags & APC_EXTENSIBLE ? "extensible" : "non-extensible",
		csiz->lower_bound, csiz->upper_bound, csiz->effective_bits);

	if(csiz->flags & APC_EXTENSIBLE) {
		int inext = per_get_few_bits(pd, 1);
		if(inext < 0) RETURN(RC_WMORE);
		if(inext) {
			csiz = &asn_DEF_OCTET_STRING_constraints.size;
			cval = &asn_DEF_OCTET_STRING_constraints.value;
			unit_bits = canonical_unit_bits;
		}
	}

	if(csiz->effective_bits >= 0) {
		FREEMEM(st->buf);
		if(bpc) {
			st->size = csiz->upper_bound * bpc;
		} else {
			st->size = (csiz->upper_bound + 7) >> 3;
		}
		st->buf = (uint8_t *)MALLOC(st->size + 1);
		if(!st->buf) { st->size = 0; RETURN(RC_FAIL); }
	}

	/* X.691, #16.5: zero-length encoding */
	/* X.691, #16.6: short fixed length encoding (up to 2 octets) */
	/* X.691, #16.7: long fixed length encoding (up to 64K octets) */
	if(csiz->effective_bits == 0) {
		int ret;
		if(bpc) {
			ASN_DEBUG("Encoding OCTET STRING size %ld",
				csiz->upper_bound);
			ret = OCTET_STRING_per_get_characters(pd, st->buf,
				csiz->upper_bound, bpc, unit_bits,
				cval->lower_bound, cval->upper_bound, pc);
			if(ret > 0) RETURN(RC_FAIL);
		} else {
			ASN_DEBUG("Encoding BIT STRING size %ld",
				csiz->upper_bound);
			ret = per_get_many_bits(pd, st->buf, 0,
					    unit_bits * csiz->upper_bound);
		}
		if(ret < 0) RETURN(RC_WMORE);
		consumed_myself += unit_bits * csiz->upper_bound;
		st->buf[st->size] = 0;
		if(bpc == 0) {
			int ubs = (csiz->upper_bound & 0x7);
			st->bits_unused = ubs ? 8 - ubs : 0;
		}
		RETURN(RC_OK);
	}

	st->size = 0;
	do {
		ssize_t raw_len;
		ssize_t len_bytes;
		ssize_t len_bits;
		void *p;
		int ret;

		/* Get the PER length */
		raw_len = uper_get_length(pd, csiz->effective_bits, &repeat);
		if(raw_len < 0) RETURN(RC_WMORE);
		raw_len += csiz->lower_bound;

		ASN_DEBUG("Got PER length eb %ld, len %ld, %s (%s)",
			(long)csiz->effective_bits, (long)raw_len,
			repeat ? "repeat" : "once", td->name);
		if(bpc) {
			len_bytes = raw_len * bpc;
			len_bits = len_bytes * unit_bits;
		} else {
			len_bits = raw_len;
			len_bytes = (len_bits + 7) >> 3;
			if(len_bits & 0x7)
				st->bits_unused = 8 - (len_bits & 0x7);
			/* len_bits be multiple of 16K if repeat is set */
		}
		p = REALLOC(st->buf, st->size + len_bytes + 1);
		if(!p) RETURN(RC_FAIL);
		st->buf = (uint8_t *)p;

		if(bpc) {
			ret = OCTET_STRING_per_get_characters(pd,
				&st->buf[st->size], raw_len, bpc, unit_bits,
				cval->lower_bound, cval->upper_bound, pc);
			if(ret > 0) RETURN(RC_FAIL);
		} else {
			ret = per_get_many_bits(pd, &st->buf[st->size],
				0, len_bits);
		}
		if(ret < 0) RETURN(RC_WMORE);
		st->size += len_bytes;
	} while(repeat);
	st->buf[st->size] = 0;	/* nul-terminate */

	return rval;
}